

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

ListNode * list_add_value(ListNode *head,void *value,int refcount)

{
  ListNode *pLVar1;
  int in_EDX;
  void *in_RSI;
  ListNode *new_node;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  pLVar1 = (ListNode *)malloc(0x20);
  _assert_true((unsigned_long)in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (char *)pLVar1,in_stack_ffffffffffffffdc);
  _assert_true((unsigned_long)in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (char *)pLVar1,in_stack_ffffffffffffffdc);
  pLVar1->value = in_RSI;
  pLVar1->refcount = in_EDX;
  pLVar1 = list_add(pLVar1,(ListNode *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                   );
  return pLVar1;
}

Assistant:

static ListNode* list_add_value(ListNode * const head, const void *value,
                                     const int refcount) {
    ListNode * const new_node = (ListNode*)malloc(sizeof(ListNode));
    assert_non_null(head);
    assert_non_null(value);
    new_node->value = value;
    new_node->refcount = refcount;
    return list_add(head, new_node);
}